

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O0

void WebRtcAgc_SaturationCtrl(LegacyAgc *stt,uint8_t *saturated,int32_t *env)

{
  short sVar1;
  short local_22;
  int16_t tmpW16;
  int16_t i;
  int32_t *env_local;
  uint8_t *saturated_local;
  LegacyAgc *stt_local;
  
  for (local_22 = 0; local_22 < 10; local_22 = local_22 + 1) {
    sVar1 = (short)(env[local_22] >> 0x14);
    if (0x36b < sVar1) {
      stt->envSum = stt->envSum + sVar1;
    }
  }
  if (25000 < stt->envSum) {
    *saturated = '\x01';
    stt->envSum = 0;
  }
  stt->envSum = (int16_t)(stt->envSum * 0x7eb8 >> 0xf);
  return;
}

Assistant:

void WebRtcAgc_SaturationCtrl(LegacyAgc *stt, uint8_t *saturated, const int32_t *env) {
    int16_t i, tmpW16;

    /* Check if the signal is saturated */
    for (i = 0; i < 10; i++) {
        tmpW16 = (int16_t) (env[i] >> 20);
        if (tmpW16 > 875) {
            stt->envSum += tmpW16;
        }
    }

    if (stt->envSum > 25000) {
        *saturated = 1;
        stt->envSum = 0;
    }

    /* stt->envSum *= 0.99; */
    stt->envSum = (int16_t) ((stt->envSum * 32440) >> 15);
}